

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O2

void __thiscall Array2dTest_Access_Test::TestBody(Array2dTest_Access_Test *this)

{
  int iVar1;
  long lVar2;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  AssertionResult gtest_ar;
  Array2d<int> a;
  
  pica::Array2d<int>::Array2d(&a,3,5,-1);
  for (iVar1 = 0; iVar1 != 3; iVar1 = iVar1 + 1) {
    for (lVar2 = 0; (int)lVar2 != 5; lVar2 = lVar2 + 1) {
      a.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [(long)a.size.y * (long)iVar1 + lVar2] = iVar1 + (int)lVar2;
    }
  }
  iVar1 = 0;
  do {
    if (iVar1 == 3) {
LAB_001a89dc:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&a.data.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    for (lVar2 = 0; (int)lVar2 != 5; lVar2 = lVar2 + 1) {
      local_70.ptr_._0_4_ = iVar1 + (int)lVar2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"i + j","a(i, j)",(int *)&local_70,
                 a.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)a.size.y * (long)iVar1 + lVar2);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_70);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/ArrayTests.cpp"
                   ,0x5f,message);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_70);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        goto LAB_001a89dc;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

TEST(Array2dTest, Access)
{
    Array2d<int> a(3, 5, -1);
    for (int i = 0; i < 3; i++)
    for (int j = 0; j < 5; j++)
        a(i, j) = i + j;
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 5; j++)
        ASSERT_EQ(i + j, a(i, j));
}